

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train.c
# Opt level: O0

void read_problem(char *filename)

{
  char *pcVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  ushort **ppuVar4;
  double dVar5;
  char *p;
  char *label;
  char *val;
  char *idx;
  char *endptr;
  FILE *fp;
  size_t j;
  size_t elements;
  uint local_18;
  int i;
  int inst_max_index;
  int max_index;
  char *filename_local;
  
  _inst_max_index = filename;
  endptr = (char *)fopen(filename,"r");
  if ((FILE *)endptr != (FILE *)0x0) {
    prob.l = 0;
    j = 0;
    max_line_len = 0x400;
    line = (char *)malloc(0x400);
    while (pcVar1 = readline((FILE *)endptr), pcVar1 != (char *)0x0) {
      strtok(line," \t");
      while ((pcVar1 = strtok((char *)0x0," \t"), pcVar1 != (char *)0x0 && (*pcVar1 != '\n'))) {
        j = j + 1;
      }
      j = j + 1;
      prob.l = prob.l + 1;
    }
    rewind((FILE *)endptr);
    prob.bias = bias;
    prob.y = (double *)malloc((long)prob.l << 3);
    prob.x = (feature_node **)malloc((long)prob.l << 3);
    x_space = (feature_node *)malloc((j + (long)prob.l) * 0x10);
    i = 0;
    fp = (FILE *)0x0;
    for (elements._4_4_ = 0; elements._4_4_ < prob.l; elements._4_4_ = elements._4_4_ + 1) {
      local_18 = 0;
      readline((FILE *)endptr);
      prob.x[elements._4_4_] = x_space + (long)fp;
      pcVar1 = strtok(line," \t\n");
      if (pcVar1 == (char *)0x0) {
        exit_input_error(0x1b4,elements._4_4_ + 1);
      }
      dVar5 = strtod(pcVar1,&idx);
      prob.y[elements._4_4_] = dVar5;
      if ((idx == pcVar1) || (*idx != '\0')) {
        exit_input_error(0x1b9,elements._4_4_ + 1);
      }
      while( true ) {
        pcVar1 = strtok((char *)0x0,":");
        __nptr = strtok((char *)0x0," \t");
        if (__nptr == (char *)0x0) break;
        piVar2 = __errno_location();
        *piVar2 = 0;
        lVar3 = strtol(pcVar1,&idx,10);
        x_space[(long)fp].index = (int)lVar3;
        if ((int)local_18 < x_space[(long)fp].index) {
          if (((idx == pcVar1) || (piVar2 = __errno_location(), *piVar2 != 0)) || (*idx != '\0')) {
            exit_input_error(0x1ca,elements._4_4_ + 1);
          }
          else {
            local_18 = x_space[(long)fp].index;
          }
        }
        else {
          printf("Error: column index must be ordered : x_space[j].index(%d) inst_max_index(%d)\n",
                 (ulong)(uint)x_space[(long)fp].index,(ulong)local_18);
          exit_input_error(0x1c8,elements._4_4_ + 1);
        }
        piVar2 = __errno_location();
        *piVar2 = 0;
        dVar5 = strtod(__nptr,&idx);
        x_space[(long)fp].value = dVar5;
        if (((idx == __nptr) || (piVar2 = __errno_location(), *piVar2 != 0)) ||
           ((*idx != '\0' && (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*idx] & 0x2000) == 0)))) {
          exit_input_error(0x1d2,elements._4_4_ + 1);
        }
        fp = (FILE *)((long)&fp->_flags + 1);
      }
      if (i < (int)local_18) {
        i = local_18;
      }
      if (0.0 <= prob.bias) {
        x_space[(long)fp].value = prob.bias;
        fp = (FILE *)((long)&fp->_flags + 1);
      }
      x_space[(long)fp].index = -1;
      fp = (FILE *)((long)&fp->_flags + 1);
    }
    if (prob.bias < 0.0) {
      prob.n = i;
    }
    else {
      prob.n = i + 1;
      for (elements._4_4_ = 1; elements._4_4_ < prob.l; elements._4_4_ = elements._4_4_ + 1) {
        prob.x[elements._4_4_][-2].index = prob.n;
      }
      x_space[(long)(fp[-1]._unused2 + 0x12)].index = prob.n;
    }
    fclose((FILE *)endptr);
    return;
  }
  fprintf(_stderr,"can\'t open input file %s\n",_inst_max_index);
  exit(1);
}

Assistant:

void read_problem(const char *filename)
{
	int max_index, inst_max_index, i;
	size_t elements, j;
	FILE *fp = fopen(filename,"r");
	char *endptr;
	char *idx, *val, *label;

	if(fp == NULL)
	{
		fprintf(stderr,"can't open input file %s\n",filename);
		exit(1);
	}

	prob.l = 0;
	elements = 0;
	max_line_len = 1024;
	line = Malloc(char,max_line_len);
	while(readline(fp)!=NULL)
	{
		char *p = strtok(line," \t"); // label

		// features
		while(1)
		{
			p = strtok(NULL," \t");
			if(p == NULL || *p == '\n') // check '\n' as ' ' may be after the last feature
				break;
			elements++;
		}
		elements++; // for bias term
		prob.l++;
	}
	rewind(fp);

	prob.bias=bias;

	prob.y = Malloc(double,prob.l);
	prob.x = Malloc(struct feature_node *,prob.l);
	x_space = Malloc(struct feature_node,elements+prob.l);

	max_index = 0;
	j=0;
	for(i=0;i<prob.l;i++)
	{
		inst_max_index = 0; // strtol gives 0 if wrong format
		readline(fp);
		prob.x[i] = &x_space[j];
		label = strtok(line," \t\n");
		if(label == NULL) { // empty line
			exit_input_error(__LINE__, i+1);
		}

		prob.y[i] = strtod(label,&endptr);
		if(endptr == label || *endptr != '\0') {
			exit_input_error(__LINE__, i+1);
		}

		while(1)
		{
			idx = strtok(NULL,":");
			val = strtok(NULL," \t");

			if(val == NULL)
				break;

			errno = 0;
			x_space[j].index = (int) strtol(idx,&endptr,10);
			if(x_space[j].index <= inst_max_index) {
				printf("Error: column index must be ordered : x_space[j].index(%d) inst_max_index(%d)\n", x_space[j].index, inst_max_index) ;
				exit_input_error(__LINE__, i+1);
			} else if(endptr == idx || errno != 0 || *endptr != '\0') {
				exit_input_error(__LINE__, i+1);
			}
			else
				inst_max_index = x_space[j].index;

			errno = 0;
			x_space[j].value = strtod(val,&endptr);
			if(endptr == val || errno != 0 || (*endptr != '\0' && !isspace(*endptr))) {
				exit_input_error(__LINE__, i+1);
			}

			++j;
		}

		if(inst_max_index > max_index)
			max_index = inst_max_index;

		if(prob.bias >= 0)
			x_space[j++].value = prob.bias;

		x_space[j++].index = -1;
	}

	if(prob.bias >= 0)
	{
		prob.n=max_index+1;
		for(i=1;i<prob.l;i++)
			(prob.x[i]-2)->index = prob.n;
		x_space[j-2].index = prob.n;
	}
	else
		prob.n=max_index;

	fclose(fp);
}